

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void StoreCompressedMetaBlockHeader
               (int is_final_block,size_t length,size_t *storage_ix,uint8_t *storage)

{
  ulong *puVar1;
  long in_RCX;
  ulong *in_RDX;
  size_t in_RSI;
  int in_EDI;
  uint64_t nibblesbits;
  size_t nlenbits;
  uint64_t lenbits;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t local_178;
  size_t local_170;
  uint64_t local_168;
  long local_160;
  ulong *local_158;
  int local_144;
  ulong local_b0;
  ulong *local_a8;
  undefined8 local_90;
  undefined8 local_88;
  ulong local_80;
  ulong *local_78;
  long local_60;
  undefined8 local_58;
  ulong local_50;
  ulong *local_48;
  ulong local_40;
  ulong *local_38;
  
  local_60 = (long)in_EDI;
  local_58 = 1;
  local_78 = (ulong *)(in_RCX + (*in_RDX >> 3));
  local_80 = local_60 << ((byte)*in_RDX & 7) | (ulong)(byte)*local_78;
  *local_78 = local_80;
  *in_RDX = *in_RDX + 1;
  if (in_EDI != 0) {
    local_88 = 1;
    local_90 = 0;
    local_a8 = (ulong *)(in_RCX + (*in_RDX >> 3));
    local_b0 = 0L << ((byte)*in_RDX & 7) | (ulong)(byte)*local_a8;
    *local_a8 = local_b0;
    *in_RDX = *in_RDX + 1;
    local_40 = local_b0;
    local_38 = local_a8;
  }
  local_160 = in_RCX;
  local_158 = in_RDX;
  local_144 = in_EDI;
  local_50 = local_80;
  local_48 = local_78;
  BrotliEncodeMlen(in_RSI,&local_168,&local_170,&local_178);
  puVar1 = (ulong *)(local_160 + (*local_158 >> 3));
  *puVar1 = local_178 << ((byte)*local_158 & 7) | (ulong)(byte)*puVar1;
  *local_158 = *local_158 + 2;
  puVar1 = (ulong *)(local_160 + (*local_158 >> 3));
  *puVar1 = local_168 << ((byte)*local_158 & 7) | (ulong)(byte)*puVar1;
  *local_158 = local_170 + *local_158;
  if (local_144 == 0) {
    puVar1 = (ulong *)(local_160 + (*local_158 >> 3));
    *puVar1 = 0L << ((byte)*local_158 & 7) | (ulong)(byte)*puVar1;
    *local_158 = *local_158 + 1;
  }
  return;
}

Assistant:

static void StoreCompressedMetaBlockHeader(BROTLI_BOOL is_final_block,
                                           size_t length,
                                           size_t* storage_ix,
                                           uint8_t* storage) {
  uint64_t lenbits;
  size_t nlenbits;
  uint64_t nibblesbits;

  /* Write ISLAST bit. */
  BrotliWriteBits(1, (uint64_t)is_final_block, storage_ix, storage);
  /* Write ISEMPTY bit. */
  if (is_final_block) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  }

  BrotliEncodeMlen(length, &lenbits, &nlenbits, &nibblesbits);
  BrotliWriteBits(2, nibblesbits, storage_ix, storage);
  BrotliWriteBits(nlenbits, lenbits, storage_ix, storage);

  if (!is_final_block) {
    /* Write ISUNCOMPRESSED bit. */
    BrotliWriteBits(1, 0, storage_ix, storage);
  }
}